

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void ColorSpaceInverseTransform_C
               (VP8LTransform *transform,int y_start,int y_end,uint32_t *src,uint32_t *dst)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t *in_RCX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t *in_R8;
  uint32_t *src_end;
  uint32_t *src_safe_end;
  VP8LMultipliers m;
  uint32_t *pred;
  uint32_t *pred_row;
  int y;
  int tiles_per_row;
  int remaining_width;
  int safe_width;
  int mask;
  int tile_width;
  int width;
  VP8LMultipliers local_53;
  uint32_t *local_50;
  uint32_t *local_48;
  uint local_3c;
  uint32_t local_38;
  int local_34;
  uint local_30;
  uint local_2c;
  int local_28;
  uint local_24;
  uint32_t *local_20;
  uint32_t *local_18;
  int local_10;
  uint local_c;
  long local_8;
  
  local_24 = *(uint *)(in_RDI + 8);
  local_28 = 1 << ((byte)*(undefined4 *)(in_RDI + 4) & 0x1f);
  local_2c = local_28 - 1;
  local_30 = local_24 & (local_2c ^ 0xffffffff);
  local_34 = local_24 - local_30;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_38 = VP8LSubSampleSize(local_24,*(uint32_t *)(in_RDI + 4));
  local_3c = local_c;
  local_48 = (uint32_t *)
             (*(long *)(local_8 + 0x10) +
             (long)(int)(((int)local_c >> ((byte)*(undefined4 *)(local_8 + 4) & 0x1f)) * local_38) *
             4);
  while ((int)local_3c < local_10) {
    local_50 = local_48;
    memset(&local_53,0,3);
    puVar2 = local_18 + (int)local_30;
    puVar3 = local_18 + (int)local_24;
    for (; local_18 < puVar2; local_18 = local_18 + local_28) {
      uVar1 = *local_50;
      local_50 = local_50 + 1;
      ColorCodeToMultipliers(uVar1,&local_53);
      (*VP8LTransformColorInverse)(&local_53,local_18,local_28,local_20);
      local_20 = local_20 + local_28;
    }
    if (local_18 < puVar3) {
      uVar1 = *local_50;
      local_50 = local_50 + 1;
      ColorCodeToMultipliers(uVar1,&local_53);
      (*VP8LTransformColorInverse)(&local_53,local_18,local_34,local_20);
      local_18 = local_18 + local_34;
      local_20 = local_20 + local_34;
    }
    local_3c = local_3c + 1;
    if ((local_3c & local_2c) == 0) {
      local_48 = local_48 + (int)local_38;
    }
  }
  return;
}

Assistant:

static void ColorSpaceInverseTransform_C(const VP8LTransform* const transform,
                                         int y_start, int y_end,
                                         const uint32_t* src, uint32_t* dst) {
  const int width = transform->xsize;
  const int tile_width = 1 << transform->bits;
  const int mask = tile_width - 1;
  const int safe_width = width & ~mask;
  const int remaining_width = width - safe_width;
  const int tiles_per_row = VP8LSubSampleSize(width, transform->bits);
  int y = y_start;
  const uint32_t* pred_row =
      transform->data + (y >> transform->bits) * tiles_per_row;

  while (y < y_end) {
    const uint32_t* pred = pred_row;
    VP8LMultipliers m = { 0, 0, 0 };
    const uint32_t* const src_safe_end = src + safe_width;
    const uint32_t* const src_end = src + width;
    while (src < src_safe_end) {
      ColorCodeToMultipliers(*pred++, &m);
      VP8LTransformColorInverse(&m, src, tile_width, dst);
      src += tile_width;
      dst += tile_width;
    }
    if (src < src_end) {  // Left-overs using C-version.
      ColorCodeToMultipliers(*pred++, &m);
      VP8LTransformColorInverse(&m, src, remaining_width, dst);
      src += remaining_width;
      dst += remaining_width;
    }
    ++y;
    if ((y & mask) == 0) pred_row += tiles_per_row;
  }
}